

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O0

void highbd_update_mask1(__m128i *cmp_mask0,int16_t *iscan_ptr,int *is_found,__m128i *mask)

{
  longlong lVar1;
  longlong lVar2;
  __m128i alVar3;
  ulong local_a8;
  ulong uStack_a0;
  __m128i mask0;
  __m128i iscan0;
  __m128i temp_mask;
  __m128i *mask_local;
  int *is_found_local;
  int16_t *iscan_ptr_local;
  __m128i *cmp_mask0_local;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  local_a8 = 0;
  uStack_a0 = 0;
  alVar3 = *cmp_mask0;
  if (((((((((((((((((undefined1  [16])alVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                   || ((undefined1  [16])alVar3 >> 0xf & (undefined1  [16])0x1) !=
                      (undefined1  [16])0x0) ||
                  ((undefined1  [16])alVar3 >> 0x17 & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0) ||
                 ((undefined1  [16])alVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                 ) || ((undefined1  [16])alVar3 >> 0x27 & (undefined1  [16])0x1) !=
                      (undefined1  [16])0x0) ||
               ((undefined1  [16])alVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
              || ((undefined1  [16])alVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0
              ) || ((undefined1  [16])alVar3 >> 0x3f & (undefined1  [16])0x1) !=
                   (undefined1  [16])0x0) ||
            ((undefined1  [16])alVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           ((undefined1  [16])alVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          ((undefined1  [16])alVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         ((undefined1  [16])alVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        ((undefined1  [16])alVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       ((undefined1  [16])alVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      ((undefined1  [16])alVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (*cmp_mask0)[1] < 0) {
    local_a8 = (*cmp_mask0)[0] & *(ulong *)iscan_ptr;
    uStack_a0 = (*cmp_mask0)[1] & *(ulong *)(iscan_ptr + 4);
    *is_found = 1;
  }
  lVar1 = (*mask)[0];
  lVar2 = (*mask)[1];
  local_18 = (short)local_a8;
  sStack_16 = (short)(local_a8 >> 0x10);
  sStack_14 = (short)(local_a8 >> 0x20);
  sStack_12 = (short)(local_a8 >> 0x30);
  sStack_10 = (short)uStack_a0;
  sStack_e = (short)(uStack_a0 >> 0x10);
  sStack_c = (short)(uStack_a0 >> 0x20);
  sStack_a = (short)(uStack_a0 >> 0x30);
  local_28 = (short)lVar1;
  sStack_26 = (short)((ulong)lVar1 >> 0x10);
  sStack_24 = (short)((ulong)lVar1 >> 0x20);
  sStack_22 = (short)((ulong)lVar1 >> 0x30);
  sStack_20 = (short)lVar2;
  sStack_1e = (short)((ulong)lVar2 >> 0x10);
  sStack_1c = (short)((ulong)lVar2 >> 0x20);
  sStack_1a = (short)((ulong)lVar2 >> 0x30);
  *(ushort *)*mask =
       (ushort)(local_18 < local_28) * local_28 | (ushort)(local_18 >= local_28) * local_18;
  *(ushort *)((long)*mask + 2) =
       (ushort)(sStack_16 < sStack_26) * sStack_26 | (ushort)(sStack_16 >= sStack_26) * sStack_16;
  *(ushort *)((long)*mask + 4) =
       (ushort)(sStack_14 < sStack_24) * sStack_24 | (ushort)(sStack_14 >= sStack_24) * sStack_14;
  *(ushort *)((long)*mask + 6) =
       (ushort)(sStack_12 < sStack_22) * sStack_22 | (ushort)(sStack_12 >= sStack_22) * sStack_12;
  *(ushort *)(*mask + 1) =
       (ushort)(sStack_10 < sStack_20) * sStack_20 | (ushort)(sStack_10 >= sStack_20) * sStack_10;
  *(ushort *)((long)*mask + 10) =
       (ushort)(sStack_e < sStack_1e) * sStack_1e | (ushort)(sStack_e >= sStack_1e) * sStack_e;
  *(ushort *)((long)*mask + 0xc) =
       (ushort)(sStack_c < sStack_1c) * sStack_1c | (ushort)(sStack_c >= sStack_1c) * sStack_c;
  *(ushort *)((long)*mask + 0xe) =
       (ushort)(sStack_a < sStack_1a) * sStack_1a | (ushort)(sStack_a >= sStack_1a) * sStack_a;
  return;
}

Assistant:

static inline void highbd_update_mask1(__m128i *cmp_mask0,
                                       const int16_t *iscan_ptr, int *is_found,
                                       __m128i *mask) {
  __m128i temp_mask = _mm_setzero_si128();
  if (_mm_movemask_epi8(*cmp_mask0)) {
    __m128i iscan0 = _mm_load_si128((const __m128i *)(iscan_ptr));
    __m128i mask0 = _mm_and_si128(*cmp_mask0, iscan0);
    temp_mask = mask0;
    *is_found = 1;
  }
  *mask = _mm_max_epi16(temp_mask, *mask);
}